

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageReceiver.cpp
# Opt level: O1

int __thiscall unixsocketipc::MessageReceiver::listen(MessageReceiver *this,int __fd,int __n)

{
  bool bVar1;
  int client_socket_fd;
  undefined7 extraout_var;
  uint uVar3;
  undefined8 unaff_R15;
  uint remote_length;
  sockaddr_un remote;
  socklen_t local_a4;
  sockaddr local_9e [6];
  ulong uVar2;
  
  if (this->server_socket_fd == 0) {
    uVar3 = 0;
  }
  else {
    ::listen(this->server_socket_fd,1);
    local_a4 = 0x6e;
    uVar2 = CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
    do {
      uVar3 = (uint)uVar2;
      if ((char)uVar2 == '\0') break;
      client_socket_fd = accept(this->server_socket_fd,local_9e,&local_a4);
      if (client_socket_fd != -1) {
        if ((this->on_client_connected).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(this->on_client_connected)._M_invoker)((_Any_data *)&this->on_client_connected);
        }
        bVar1 = handle_next_client(this,client_socket_fd);
        uVar2 = CONCAT71(extraout_var,bVar1);
        close(client_socket_fd);
      }
      uVar2 = uVar2 & 0xffffffff;
    } while (client_socket_fd != -1);
    uVar3 = uVar3 ^ 1;
  }
  return uVar3;
}

Assistant:

bool MessageReceiver::listen() {
   if (!server_socket_fd) {
      DEBUG_MSG("%s: not initialized\n", __FUNCTION__);
      return false;
   }

   // mark socket as listening socket
   ::listen(server_socket_fd, 1); // 1 is max size of waiting connections queue, more connection will be rejected

   sockaddr_un remote;
   unsigned remote_length = sizeof(remote);

   // listen for incoming connections
   bool keep_working = true;
   while (keep_working) {
       DEBUG_MSG("%s: listening for incoming connection...\n", __FUNCTION__);

       // 1. accept new client socket
       int client_socket_fd = accept(server_socket_fd, (sockaddr*)&remote, &remote_length); // remote is filled with remote config
       if (client_socket_fd == -1) {
          DEBUG_MSG("%s: accept failed\n", __FUNCTION__);
          return false;
       }

       // 2. notify about new client connected
       if (on_client_connected)
           on_client_connected();

       // 3. handle the client
       keep_working = handle_next_client(client_socket_fd);

       // 4. communication done. Close the client socket
      ::close(client_socket_fd);
   }

   DEBUG_MSG("%s: listening done\n", __FUNCTION__);
   return true;
}